

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::node_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::node_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
                  *this,node_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                        *container,MatchResultListener *listener)

{
  undefined1 auVar1 [16];
  char cVar2;
  pointer pMVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  pointer pMVar17;
  unique_ptr<int,_std::default_delete<int>_> *extraout_RDX;
  unique_ptr<int,_std::default_delete<int>_> *extraout_RDX_00;
  unique_ptr<int,_std::default_delete<int>_> *extraout_RDX_01;
  unique_ptr<int,_std::default_delete<int>_> *puVar18;
  pointer pMVar19;
  slot_type *pptVar20;
  pointer pcVar21;
  long lVar22;
  size_t sVar23;
  long lVar24;
  unique_ptr<int,_std::default_delete<int>_> *puVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  char in_XMM2_Ba;
  char in_XMM2_Bb;
  char in_XMM2_Bc;
  char in_XMM2_Bd;
  char in_XMM2_Be;
  char in_XMM2_Bf;
  char in_XMM2_Bg;
  char in_XMM2_Bh;
  char in_XMM2_Bi;
  char in_XMM2_Bj;
  char in_XMM2_Bk;
  char in_XMM2_Bl;
  char in_XMM2_Bm;
  char in_XMM2_Bn;
  char in_XMM2_Bo;
  byte in_XMM2_Bp;
  vector<char,_std::allocator<char>_> did_match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix matrix;
  DummyMatchResultListener dummy;
  allocator_type local_d9;
  MatchResultListener *local_d8;
  size_t local_d0;
  undefined1 local_c8 [16];
  pointer local_b8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  unique_ptr<int,_std::default_delete<int>_> *local_70;
  MatchMatrix local_68;
  MatchResultListener local_40;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar18 = (unique_ptr<int,_std::default_delete<int>_> *)
            (container->
            super_raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            ).ctrl_;
  pptVar20 = (container->
             super_raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             ).slots_;
  cVar2 = *(char *)&(puVar18->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
  puVar25 = puVar18;
  while (cVar2 < -1) {
    auVar1 = *(undefined1 (*) [16])puVar25;
    iVar6 = -(uint)(CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))) ==
                   CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))));
    iVar7 = -(uint)(CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))) ==
                   CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))));
    iVar8 = -(uint)(CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))) ==
                   CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))));
    iVar9 = -(uint)(CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))) ==
                   CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))));
    in_XMM2_Ba = -(auVar1[0] < (char)iVar6);
    in_XMM2_Bb = -(auVar1[1] < (char)((uint)iVar6 >> 8));
    in_XMM2_Bc = -(auVar1[2] < (char)((uint)iVar6 >> 0x10));
    in_XMM2_Bd = -(auVar1[3] < (char)((uint)iVar6 >> 0x18));
    in_XMM2_Be = -(auVar1[4] < (char)iVar7);
    in_XMM2_Bf = -(auVar1[5] < (char)((uint)iVar7 >> 8));
    in_XMM2_Bg = -(auVar1[6] < (char)((uint)iVar7 >> 0x10));
    in_XMM2_Bh = -(auVar1[7] < (char)((uint)iVar7 >> 0x18));
    in_XMM2_Bi = -(auVar1[8] < (char)iVar8);
    in_XMM2_Bj = -(auVar1[9] < (char)((uint)iVar8 >> 8));
    in_XMM2_Bk = -(auVar1[10] < (char)((uint)iVar8 >> 0x10));
    in_XMM2_Bl = -(auVar1[0xb] < (char)((uint)iVar8 >> 0x18));
    in_XMM2_Bm = -(auVar1[0xc] < (char)iVar9);
    in_XMM2_Bn = -(auVar1[0xd] < (char)((uint)iVar9 >> 8));
    in_XMM2_Bo = -(auVar1[0xe] < (char)((uint)iVar9 >> 0x10));
    in_XMM2_Bp = -(auVar1[0xf] < (char)((uint)iVar9 >> 0x18));
    auVar1[1] = in_XMM2_Bb;
    auVar1[0] = in_XMM2_Ba;
    auVar1[2] = in_XMM2_Bc;
    auVar1[3] = in_XMM2_Bd;
    auVar1[4] = in_XMM2_Be;
    auVar1[5] = in_XMM2_Bf;
    auVar1[6] = in_XMM2_Bg;
    auVar1[7] = in_XMM2_Bh;
    auVar1[8] = in_XMM2_Bi;
    auVar1[9] = in_XMM2_Bj;
    auVar1[10] = in_XMM2_Bk;
    auVar1[0xb] = in_XMM2_Bl;
    auVar1[0xc] = in_XMM2_Bm;
    auVar1[0xd] = in_XMM2_Bn;
    auVar1[0xe] = in_XMM2_Bo;
    auVar1[0xf] = in_XMM2_Bp;
    auVar5[1] = in_XMM2_Bb;
    auVar5[0] = in_XMM2_Ba;
    auVar5[2] = in_XMM2_Bc;
    auVar5[3] = in_XMM2_Bd;
    auVar5[4] = in_XMM2_Be;
    auVar5[5] = in_XMM2_Bf;
    auVar5[6] = in_XMM2_Bg;
    auVar5[7] = in_XMM2_Bh;
    auVar5[8] = in_XMM2_Bi;
    auVar5[9] = in_XMM2_Bj;
    auVar5[10] = in_XMM2_Bk;
    auVar5[0xb] = in_XMM2_Bl;
    auVar5[0xc] = in_XMM2_Bm;
    auVar5[0xd] = in_XMM2_Bn;
    auVar5[0xe] = in_XMM2_Bo;
    auVar5[0xf] = in_XMM2_Bp;
    auVar13[1] = in_XMM2_Bd;
    auVar13[0] = in_XMM2_Bc;
    auVar13[2] = in_XMM2_Be;
    auVar13[3] = in_XMM2_Bf;
    auVar13[4] = in_XMM2_Bg;
    auVar13[5] = in_XMM2_Bh;
    auVar13[6] = in_XMM2_Bi;
    auVar13[7] = in_XMM2_Bj;
    auVar13[8] = in_XMM2_Bk;
    auVar13[9] = in_XMM2_Bl;
    auVar13[10] = in_XMM2_Bm;
    auVar13[0xb] = in_XMM2_Bn;
    auVar13[0xc] = in_XMM2_Bo;
    auVar13[0xd] = in_XMM2_Bp;
    auVar12[1] = in_XMM2_Be;
    auVar12[0] = in_XMM2_Bd;
    auVar12[2] = in_XMM2_Bf;
    auVar12[3] = in_XMM2_Bg;
    auVar12[4] = in_XMM2_Bh;
    auVar12[5] = in_XMM2_Bi;
    auVar12[6] = in_XMM2_Bj;
    auVar12[7] = in_XMM2_Bk;
    auVar12[8] = in_XMM2_Bl;
    auVar12[9] = in_XMM2_Bm;
    auVar12[10] = in_XMM2_Bn;
    auVar12[0xb] = in_XMM2_Bo;
    auVar12[0xc] = in_XMM2_Bp;
    auVar11[1] = in_XMM2_Bf;
    auVar11[0] = in_XMM2_Be;
    auVar11[2] = in_XMM2_Bg;
    auVar11[3] = in_XMM2_Bh;
    auVar11[4] = in_XMM2_Bi;
    auVar11[5] = in_XMM2_Bj;
    auVar11[6] = in_XMM2_Bk;
    auVar11[7] = in_XMM2_Bl;
    auVar11[8] = in_XMM2_Bm;
    auVar11[9] = in_XMM2_Bn;
    auVar11[10] = in_XMM2_Bo;
    auVar11[0xb] = in_XMM2_Bp;
    auVar10[1] = in_XMM2_Bg;
    auVar10[0] = in_XMM2_Bf;
    auVar10[2] = in_XMM2_Bh;
    auVar10[3] = in_XMM2_Bi;
    auVar10[4] = in_XMM2_Bj;
    auVar10[5] = in_XMM2_Bk;
    auVar10[6] = in_XMM2_Bl;
    auVar10[7] = in_XMM2_Bm;
    auVar10[8] = in_XMM2_Bn;
    auVar10[9] = in_XMM2_Bo;
    auVar10[10] = in_XMM2_Bp;
    uVar15 = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM2_Bp,
                                               CONCAT18(in_XMM2_Bo,
                                                        CONCAT17(in_XMM2_Bn,
                                                                 CONCAT16(in_XMM2_Bm,
                                                                          CONCAT15(in_XMM2_Bl,
                                                                                   CONCAT14(
                                                  in_XMM2_Bk,
                                                  CONCAT13(in_XMM2_Bj,
                                                           CONCAT12(in_XMM2_Bi,
                                                                    CONCAT11(in_XMM2_Bh,in_XMM2_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM2_Bp,
                                               CONCAT17(in_XMM2_Bo,
                                                        CONCAT16(in_XMM2_Bn,
                                                                 CONCAT15(in_XMM2_Bm,
                                                                          CONCAT14(in_XMM2_Bl,
                                                                                   CONCAT13(
                                                  in_XMM2_Bk,
                                                  CONCAT12(in_XMM2_Bj,
                                                           CONCAT11(in_XMM2_Bi,in_XMM2_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM2_Bp >> 7) << 0xf) + 1;
    uVar4 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    uVar16 = (ulong)uVar4;
    pptVar20 = pptVar20 + uVar16;
    cVar2 = *(char *)((long)&(puVar25->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>.
                             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar16);
    puVar25 = (unique_ptr<int,_std::default_delete<int>_> *)
              ((long)&(puVar25->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar16);
  }
  puVar18 = (unique_ptr<int,_std::default_delete<int>_> *)
            ((long)&(puVar18->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl +
            (container->
            super_raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            ).capacity_);
  local_b8 = (pointer)0x0;
  local_c8 = (undefined1  [16])0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0025ef68;
  local_d8 = listener;
  if (puVar25 == puVar18) {
    pMVar19 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar17 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar23 = 0;
  }
  else {
    sVar23 = 0;
    local_70 = puVar18;
    do {
      if (local_d8->stream_ != (ostream *)0x0) {
        PrintToString<std::unique_ptr<int,std::default_delete<int>>>
                  (&local_a8,(testing *)*pptVar20,puVar18);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                   &local_a8);
        puVar18 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_),
                          local_a8.field_2._M_allocated_capacity + 1);
          puVar18 = extraout_RDX_00;
        }
      }
      pMVar3 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar17 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pMVar19 = pMVar17;
      local_d0 = sVar23;
      if (pMVar17 != pMVar3) {
        lVar22 = 0;
        lVar24 = 0;
        pMVar19 = pMVar3;
        do {
          local_a8._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::MatchAndExplain
                         ((MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)
                          ((long)&(pMVar19->
                                  super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>
                                  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface
                          + lVar22),*pptVar20,&local_40);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    ((vector<char,_std::allocator<char>_> *)local_c8,(char *)&local_a8);
          lVar24 = lVar24 + 1;
          pMVar19 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar17 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar22 = lVar22 + 0x18;
          puVar18 = extraout_RDX_01;
        } while (lVar24 != ((long)pMVar17 - (long)pMVar19 >> 3) * -0x5555555555555555);
      }
      pptVar20 = pptVar20 + 1;
      cVar2 = *(char *)((long)&(puVar25->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>
                               ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 1);
      puVar25 = (unique_ptr<int,_std::default_delete<int>_> *)
                ((long)&(puVar25->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1);
      while (cVar2 < -1) {
        auVar27[0] = -(*(char *)&(puVar25->_M_t).
                                 super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl < -1);
        auVar27[1] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) < -1);
        auVar27[2] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 2) < -1);
        auVar27[3] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 3) < -1);
        auVar27[4] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) < -1);
        auVar27[5] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 5) < -1);
        auVar27[6] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 6) < -1);
        auVar27[7] = -(*(char *)((long)&(puVar25->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 7) < -1);
        auVar27[8] = -(*(char *)&puVar25[1]._M_t.
                                 super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl < -1);
        auVar27[9] = -(*(char *)((long)&puVar25[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) < -1);
        auVar27[10] = -(*(char *)((long)&puVar25[1]._M_t.
                                         super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                         super__Head_base<0UL,_int_*,_false>._M_head_impl + 2) < -1)
        ;
        auVar27[0xb] = -(*(char *)((long)&puVar25[1]._M_t.
                                          super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                          super__Head_base<0UL,_int_*,_false>._M_head_impl + 3) < -1
                        );
        auVar27[0xc] = -(*(char *)((long)&puVar25[1]._M_t.
                                          super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                          super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) < -1
                        );
        auVar27[0xd] = -(*(char *)((long)&puVar25[1]._M_t.
                                          super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                          super__Head_base<0UL,_int_*,_false>._M_head_impl + 5) < -1
                        );
        auVar27[0xe] = -(*(char *)((long)&puVar25[1]._M_t.
                                          super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                          super__Head_base<0UL,_int_*,_false>._M_head_impl + 6) < -1
                        );
        auVar27[0xf] = -(*(char *)((long)&puVar25[1]._M_t.
                                          super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                          super__Head_base<0UL,_int_*,_false>._M_head_impl + 7) < -1
                        );
        uVar15 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar27[0xf] >> 7) << 0xf) + 1;
        uVar4 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar16 = (ulong)uVar4;
        pptVar20 = pptVar20 + uVar16;
        cVar2 = *(char *)((long)&(puVar25->_M_t).
                                 super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar16);
        puVar25 = (unique_ptr<int,_std::default_delete<int>_> *)
                  ((long)&(puVar25->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar16);
      }
      sVar23 = local_d0 + 1;
    } while (puVar25 != local_70);
  }
  local_68.num_matchers_ = ((long)pMVar17 - (long)pMVar19 >> 3) * -0x5555555555555555;
  local_a8._M_dataplus._M_p._0_1_ = 0;
  local_68.num_elements_ = sVar23;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68.matched_,local_68.num_matchers_ * sVar23,(value_type *)&local_a8,&local_d9);
  if (sVar23 != 0) {
    pMVar17 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar19 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar14 = 0;
    pcVar21 = (pointer)local_c8._0_8_;
    do {
      bVar26 = pMVar19 != pMVar17;
      pMVar19 = pMVar17;
      if (bVar26) {
        lVar22 = 0;
        do {
          local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22 + local_68.num_matchers_ * sVar14] =
               pcVar21[lVar22] != '\0';
          lVar22 = lVar22 + 1;
          pMVar17 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar19 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar22 != ((long)pMVar19 - (long)pMVar17 >> 3) * -0x5555555555555555);
        pcVar21 = pcVar21 + lVar22;
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != sVar23);
  }
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
  }
  bVar26 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                     (&this->super_UnorderedElementsAreMatcherImplBase,&local_88,&local_68,local_d8)
  ;
  if (bVar26) {
    bVar26 = UnorderedElementsAreMatcherImplBase::FindPairing
                       (&this->super_UnorderedElementsAreMatcherImplBase,&local_68,local_d8);
  }
  else {
    bVar26 = false;
  }
  if (local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return bVar26;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }